

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Image.cxx
# Opt level: O3

void __thiscall Fl_RGB_Image::Fl_RGB_Image(Fl_RGB_Image *this,uchar *bits,int W,int H,int D,int LD)

{
  (this->super_Fl_Image).w_ = W;
  (this->super_Fl_Image).h_ = H;
  (this->super_Fl_Image).d_ = D;
  (this->super_Fl_Image)._vptr_Fl_Image = (_func_int **)&PTR__Fl_RGB_Image_002561e0;
  this->array = bits;
  this->alloc_array = 0;
  this->id_ = 0;
  this->mask_ = 0;
  (this->super_Fl_Image).data_ = (char **)&this->array;
  (this->super_Fl_Image).count_ = 1;
  (this->super_Fl_Image).ld_ = LD;
  return;
}

Assistant:

Fl_Image::Fl_Image(int W, int H, int D) :
  w_(W), h_(H), d_(D), ld_(0), count_(0), data_(0L)
{}